

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O0

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>
     ::match(matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>_> *candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>
            *matchers)

{
  bool bVar1;
  double candidate_00;
  bool local_92;
  Literal local_68;
  Literal local_40;
  GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_0> local_21;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_> *local_20;
  SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>
  *matchers_local;
  matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>_> *candidate_local;
  
  local_20 = matchers;
  matchers_local =
       (SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_> *)
       candidate;
  wasm::Literal::Literal(&local_40,candidate);
  candidate_00 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_0>::
                 operator()(&local_21,&local_40);
  bVar1 = Matcher<wasm::Match::Internal::ExactKind<double>_>::matches(&matchers->curr,candidate_00);
  local_92 = false;
  if (bVar1) {
    wasm::Literal::Literal(&local_68,candidate);
    local_92 = Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_1,_void>::
               match(&local_68);
  }
  candidate_local._7_1_ = local_92;
  if (bVar1) {
    wasm::Literal::~Literal(&local_68);
  }
  wasm::Literal::~Literal(&local_40);
  return (bool)(candidate_local._7_1_ & 1);
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }